

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_align<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                 *handler)

{
  char cVar1;
  basic_format_specs<char> *pbVar2;
  char *pcVar3;
  format_error *this;
  byte bVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  bool bVar7;
  
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
                ,0xaed,"");
  }
  bVar4 = (byte)*begin >> 3;
  pcVar3 = begin + (ulong)((0x80ff0000U >> bVar4 & 1) != 0) + (long)(char)(&DAT_005ddc30)[bVar4];
  if (end <= begin + (ulong)((0x80ff0000U >> bVar4 & 1) != 0) + (long)(char)(&DAT_005ddc30)[bVar4])
  {
    pcVar3 = begin;
  }
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '^') {
      bVar4 = 3;
LAB_00393f5e:
      if (pcVar3 != begin) {
        if (*begin == 0x7b) {
          error_handler::on_error((error_handler *)begin,"invalid fill character \'{\'");
        }
        uVar5 = (long)pcVar3 - (long)begin;
        if ((long)uVar5 < 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        if (4 < uVar5) {
          this = (format_error *)__cxa_allocate_exception(0x10);
          format_error::format_error(this,"invalid fill");
          __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
        }
        pbVar2 = (handler->
                 super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 ).super_specs_setter<char>.specs_;
        uVar6 = 0;
        do {
          (pbVar2->fill).data_[uVar6] = begin[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        (pbVar2->fill).size_ = (uchar)uVar5;
        begin = pcVar3;
      }
      pbVar2 = (handler->
               super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               ).super_specs_setter<char>.specs_;
      pbVar2->field_0x9 = pbVar2->field_0x9 & 0xf0 | bVar4;
      return begin + 1;
    }
    if (cVar1 == '>') {
      bVar4 = 2;
      goto LAB_00393f5e;
    }
    if (cVar1 == '<') {
      bVar4 = 1;
      goto LAB_00393f5e;
    }
    bVar7 = pcVar3 == begin;
    pcVar3 = begin;
    if (bVar7) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_DEPRECATED_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}